

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_info.cc
# Opt level: O2

void * v2i_AUTHORITY_INFO_ACCESS
                 (X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  enable_if_t<_internal::StackTraits<stack_st_ACCESS_DESCRIPTION>::kIsConst,_bool> eVar1;
  _Head_base<0UL,_stack_st_ACCESS_DESCRIPTION_*,_false> sk;
  size_t sVar2;
  void *pvVar3;
  tuple<ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter> tVar4;
  char *pcVar5;
  GENERAL_NAME *pGVar6;
  ASN1_OBJECT *pAVar7;
  pointer __p;
  ulong i;
  UniquePtr<ACCESS_DESCRIPTION> acc;
  UniquePtr<char> objtmp;
  UniquePtr<AUTHORITY_INFO_ACCESS> ainfo;
  unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> local_50;
  CONF_VALUE ctmp;
  
  sk._M_head_impl = (stack_st_ACCESS_DESCRIPTION *)OPENSSL_sk_new_null();
  ainfo._M_t.super___uniq_ptr_impl<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_ACCESS_DESCRIPTION_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_ACCESS_DESCRIPTION_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter,_true,_true>)
       sk._M_head_impl;
  if ((tuple<stack_st_ACCESS_DESCRIPTION_*,_bssl::internal::Deleter>)sk._M_head_impl !=
      (_Head_base<0UL,_stack_st_ACCESS_DESCRIPTION_*,_false>)0x0) {
    i = 0;
    do {
      sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      if (sVar2 <= i) {
        ainfo._M_t.super___uniq_ptr_impl<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_ACCESS_DESCRIPTION_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_ACCESS_DESCRIPTION_*,_false>._M_head_impl =
             (__uniq_ptr_data<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>)0x0;
        goto LAB_00224e2a;
      }
      pvVar3 = OPENSSL_sk_value((OPENSSL_STACK *)nval,i);
      tVar4.super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>)
           ACCESS_DESCRIPTION_new();
      acc._M_t.super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter,_true,_true>)
           tVar4.super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl;
      if (tVar4.super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>)0x0) {
LAB_00224e20:
        std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::~unique_ptr(&acc);
        break;
      }
      pcVar5 = strchr(*(char **)((long)pvVar3 + 8),0x3b);
      if (pcVar5 == (char *)0x0) {
        ERR_put_error(0x14,0,0x87,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_info.cc"
                      ,0x89);
        goto LAB_00224e20;
      }
      ctmp.name = pcVar5 + 1;
      ctmp.value = *(char **)((long)pvVar3 + 0x10);
      pGVar6 = v2i_GENERAL_NAME_ex(*(GENERAL_NAME **)
                                    ((long)tVar4.
                                           super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>.
                                           _M_head_impl + 8),(X509V3_EXT_METHOD *)method,
                                   (X509V3_CTX *)ctx,(CONF_VALUE *)&ctmp,0);
      if (pGVar6 == (GENERAL_NAME *)0x0) goto LAB_00224e20;
      objtmp._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.super__Head_base<0UL,_char_*,_false>.
      _M_head_impl = (__uniq_ptr_data<char,_bssl::internal::Deleter,_true,_true>)
                     OPENSSL_strndup(*(char **)((long)pvVar3 + 8),
                                     (long)pcVar5 - (long)*(char **)((long)pvVar3 + 8));
      if ((tuple<char_*,_bssl::internal::Deleter>)
          objtmp._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl == (_Head_base<0UL,_char_*,_false>)0x0)
      {
LAB_00224e16:
        std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&objtmp);
        goto LAB_00224e20;
      }
      pAVar7 = OBJ_txt2obj((char *)objtmp._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl,0);
      *(ASN1_OBJECT **)
       acc._M_t.super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl = pAVar7;
      if (*(long *)acc._M_t.super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl == 0) {
        ERR_put_error(0x14,0,0x65,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_info.cc"
                      ,0x98);
        ERR_add_error_data(2,"value=",
                           objtmp._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl);
        goto LAB_00224e16;
      }
      local_50._M_t.super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl =
           acc._M_t.super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl;
      acc._M_t.super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>)0x0;
      eVar1 = bssl::PushToStack<stack_st_ACCESS_DESCRIPTION>(sk._M_head_impl,&local_50);
      std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
      std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&objtmp);
      std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::~unique_ptr(&acc);
      i = i + 1;
    } while (eVar1);
  }
  sk._M_head_impl = (stack_st_ACCESS_DESCRIPTION *)0x0;
LAB_00224e2a:
  std::unique_ptr<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>::~unique_ptr(&ainfo);
  return sk._M_head_impl;
}

Assistant:

static void *v2i_AUTHORITY_INFO_ACCESS(const X509V3_EXT_METHOD *method,
                                       const X509V3_CTX *ctx,
                                       const STACK_OF(CONF_VALUE) *nval) {
  bssl::UniquePtr<AUTHORITY_INFO_ACCESS> ainfo(sk_ACCESS_DESCRIPTION_new_null());
  if (ainfo == nullptr) {
    return nullptr;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    bssl::UniquePtr<ACCESS_DESCRIPTION> acc(ACCESS_DESCRIPTION_new());
    if (acc == nullptr) {
      return nullptr;
    }
    char *ptmp = strchr(cnf->name, ';');
    if (!ptmp) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SYNTAX);
      return nullptr;
    }
    CONF_VALUE ctmp;
    ctmp.name = ptmp + 1;
    ctmp.value = cnf->value;
    if (!v2i_GENERAL_NAME_ex(acc->location, method, ctx, &ctmp, 0)) {
      return nullptr;
    }
    bssl::UniquePtr<char> objtmp(OPENSSL_strndup(cnf->name, ptmp - cnf->name));
    if (objtmp == nullptr) {
      return nullptr;
    }
    acc->method = OBJ_txt2obj(objtmp.get(), 0);
    if (!acc->method) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_BAD_OBJECT);
      ERR_add_error_data(2, "value=", objtmp.get());
      return nullptr;
    }
    if (!bssl::PushToStack(ainfo.get(), std::move(acc))) {
      return nullptr;
    }
  }
  return ainfo.release();
}